

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEmbed.c
# Opt level: O1

void Emb_ManComputeDimensions(Emb_Man_t *p,int nDims)

{
  uint *puVar1;
  uint uVar2;
  uint uVar3;
  int *piVar4;
  int iVar5;
  Vec_Int_t *pVVar6;
  Emb_Dat_t *pEVar7;
  int *piVar8;
  Emb_Obj_t *pEVar9;
  ulong uVar10;
  int iVar11;
  
  pVVar6 = Emb_ManConnectedComponents(p);
  uVar2 = pVVar6->nSize;
  if ((1 < (int)uVar2) && (piVar8 = p->pObjData, piVar8 != (int *)0x0)) {
    piVar4 = pVVar6->pArray;
    uVar10 = 0;
    do {
      if ((*(byte *)(piVar8 + (uint)piVar4[uVar10]) & 2) == 0) {
        __assert_fail("Emb_ObjIsCo(pFanin)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaEmbed.c"
                      ,0x45c,"void Emb_ManComputeDimensions(Emb_Man_t *, int)");
      }
      puVar1 = (uint *)(piVar8 + (uint)piVar4[uVar10]);
      iVar5 = piVar8[2];
      uVar3 = puVar1[2];
      piVar8[uVar10 + 5] = iVar5 - uVar3;
      puVar1[(ulong)(((*puVar1 >> 4) + puVar1[1]) - 1) + 5] = iVar5 - uVar3;
      uVar10 = uVar10 + 1;
    } while (uVar2 != uVar10);
  }
  if (pVVar6->pArray != (int *)0x0) {
    free(pVVar6->pArray);
    pVVar6->pArray = (int *)0x0;
  }
  if (pVVar6 != (Vec_Int_t *)0x0) {
    free(pVVar6);
  }
  if (p->pVecs != (Emb_Dat_t *)0x0) {
    __assert_fail("p->pVecs == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaEmbed.c"
                  ,0x463,"void Emb_ManComputeDimensions(Emb_Man_t *, int)");
  }
  pEVar7 = (Emb_Dat_t *)calloc((long)p->nObjs * (long)nDims,4);
  p->pVecs = pEVar7;
  pVVar6 = (Vec_Int_t *)malloc(0x10);
  iVar5 = 0x10;
  if (0xe < nDims - 1U) {
    iVar5 = nDims;
  }
  pVVar6->nSize = 0;
  pVVar6->nCap = iVar5;
  iVar11 = 0;
  if (iVar5 == 0) {
    piVar8 = (int *)0x0;
  }
  else {
    piVar8 = (int *)malloc((long)iVar5 << 2);
  }
  pVVar6->pArray = piVar8;
  pEVar9 = Emb_ManRandomVertex(p);
  Vec_IntPush(pVVar6,pEVar9->hHandle);
  pEVar9 = Emb_ManFindDistances(p,pVVar6,(Emb_Dat_t *)0x0);
  iVar5 = p->nReached;
  pVVar6->nSize = 0;
  if (nDims < 1) {
    nDims = iVar11;
  }
  while (nDims != iVar11) {
    Vec_IntPush(pVVar6,pEVar9->hHandle);
    if (iVar5 + -1 == iVar11) break;
    pEVar9 = Emb_ManFindDistances(p,pVVar6,p->pVecs + (long)iVar11 * (long)p->nObjs);
    iVar11 = iVar11 + 1;
    if (iVar5 != p->nReached) {
      __assert_fail("nReached == p->nReached",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaEmbed.c"
                    ,0x47c,"void Emb_ManComputeDimensions(Emb_Man_t *, int)");
    }
  }
  if (pVVar6->pArray != (int *)0x0) {
    free(pVVar6->pArray);
    pVVar6->pArray = (int *)0x0;
  }
  free(pVVar6);
  return;
}

Assistant:

void Emb_ManComputeDimensions( Emb_Man_t * p, int nDims )
{
    Emb_Obj_t * pRandom, * pPivot;
    Vec_Int_t * vStart, * vComps;
    int d, nReached;
    int i;//, Counter;
    // connect unconnected components
    vComps = Emb_ManConnectedComponents( p );
//    printf( "Components = %d. Considered %d objects (out of %d).\n", Vec_IntSize(vComps), p->nReached, Emb_ManObjNum(p) );
    if ( Vec_IntSize(vComps) > 1 )
    {
        Emb_Obj_t * pFanin, * pObj = Emb_ManObj( p, 0 );
        Emb_ManForEachObjVec( vComps, p, pFanin, i )
        {
            assert( Emb_ObjIsCo(pFanin) );
            pFanin->Fanios[pFanin->nFanins + pFanin->nFanouts-1] = 
                pObj->Fanios[i] = pObj->hHandle - pFanin->hHandle;
        }
    }
    Vec_IntFree( vComps );
    // allocate memory for vectors
    assert( p->pVecs == NULL );
    p->pVecs = ABC_CALLOC( Emb_Dat_t, p->nObjs * nDims );
//    for ( i = 0; i < p->nObjs * nDims; i++ )
//        p->pVecs[i] = ABC_INFINITY;
    vStart = Vec_IntAlloc( nDims );
    // get the pivot vertex
    pRandom = Emb_ManRandomVertex( p );
    Vec_IntPush( vStart, pRandom->hHandle );
    // get the most distant vertex from the pivot
    pPivot = Emb_ManFindDistances( p, vStart, NULL );
//    Emb_DumpGraphIntoFile( p );
    nReached = p->nReached;
    if ( nReached < Emb_ManObjNum(p) )
    {
//        printf( "Considering a connected component with %d objects (out of %d).\n", p->nReached, Emb_ManObjNum(p) );
    }
    // start dimensions with this vertex
    Vec_IntClear( vStart );
    for ( d = 0; d < nDims; d++ )
    {
//        printf( "%3d : Adding vertex %7d with distance %3d.\n", d+1, pPivot->Value, p->nDistMax ); 
        Vec_IntPush( vStart, pPivot->hHandle );
        if ( d+1 == nReached )
            break;
        pPivot = Emb_ManFindDistances( p, vStart, Emb_ManVec(p, d) );
        assert( nReached == p->nReached );
    }
    Vec_IntFree( vStart );
    // make sure the number of reached objects is correct
//    Counter = 0;
//    for ( i = 0; i < p->nObjs; i++ )
//        if ( p->pVecs[i] < ABC_INFINITY )
//            Counter++;
//    assert( Counter == nReached );
}